

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_start(ma_device *pDevice)

{
  ma_bool32 mVar1;
  ma_result local_4c;
  ma_result result;
  ma_device *pDevice_local;
  
  if (pDevice == (ma_device *)0x0) {
    pDevice_local._0_4_ =
         ma_post_error((ma_device *)0x0,1,
                       "ma_device_start() called with invalid arguments (pDevice == NULL).",-2);
  }
  else if (pDevice->state == 0) {
    pDevice_local._0_4_ =
         ma_post_error(pDevice,1,"ma_device_start() called for an uninitialized device.",-200);
  }
  else if (pDevice->state == 2) {
    pDevice_local._0_4_ =
         ma_post_error(pDevice,2,"ma_device_start() called when the device is already started.",-3);
  }
  else {
    ma_mutex_lock(&pDevice->lock);
    if (pDevice->state != 1) {
      __assert_fail("ma_device__get_state(pDevice) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x76ac,"ma_result ma_device_start(ma_device *)");
    }
    LOCK();
    pDevice->state = 3;
    UNLOCK();
    mVar1 = ma_context_is_backend_asynchronous(pDevice->pContext);
    if (mVar1 == 0) {
      ma_event_signal(&pDevice->wakeupEvent);
      ma_event_wait(&pDevice->startEvent);
      local_4c = pDevice->workResult;
    }
    else {
      local_4c = (*pDevice->pContext->onDeviceStart)(pDevice);
      if (local_4c == 0) {
        LOCK();
        pDevice->state = 2;
        UNLOCK();
      }
    }
    ma_mutex_unlock(&pDevice->lock);
    pDevice_local._0_4_ = local_4c;
  }
  return (ma_result)pDevice_local;
}

Assistant:

MA_API ma_result ma_device_start(ma_device* pDevice)
{
    ma_result result;

    if (pDevice == NULL) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "ma_device_start() called with invalid arguments (pDevice == NULL).", MA_INVALID_ARGS);
    }

    if (ma_device__get_state(pDevice) == MA_STATE_UNINITIALIZED) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "ma_device_start() called for an uninitialized device.", MA_DEVICE_NOT_INITIALIZED);
    }

    if (ma_device__get_state(pDevice) == MA_STATE_STARTED) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_WARNING, "ma_device_start() called when the device is already started.", MA_INVALID_OPERATION);  /* Already started. Returning an error to let the application know because it probably means they're doing something wrong. */
    }

    result = MA_ERROR;
    ma_mutex_lock(&pDevice->lock);
    {
        /* Starting and stopping are wrapped in a mutex which means we can assert that the device is in a stopped or paused state. */
        MA_ASSERT(ma_device__get_state(pDevice) == MA_STATE_STOPPED);

        ma_device__set_state(pDevice, MA_STATE_STARTING);

        /* Asynchronous backends need to be handled differently. */
        if (ma_context_is_backend_asynchronous(pDevice->pContext)) {
            result = pDevice->pContext->onDeviceStart(pDevice);
            if (result == MA_SUCCESS) {
                ma_device__set_state(pDevice, MA_STATE_STARTED);
            }
        } else {
            /*
            Synchronous backends are started by signaling an event that's being waited on in the worker thread. We first wake up the
            thread and then wait for the start event.
            */
            ma_event_signal(&pDevice->wakeupEvent);

            /*
            Wait for the worker thread to finish starting the device. Note that the worker thread will be the one who puts the device
            into the started state. Don't call ma_device__set_state() here.
            */
            ma_event_wait(&pDevice->startEvent);
            result = pDevice->workResult;
        }
    }
    ma_mutex_unlock(&pDevice->lock);

    return result;
}